

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_dense.hpp
# Opt level: O2

type * Disa::operator+(type *__return_storage_ptr__,Matrix_Dense<double,_0UL,_0UL> *matrix_0,
                      Matrix_Dense<double,_2UL,_3UL> *matrix_1)

{
  pointer pVVar1;
  pointer pVVar2;
  size_t sVar3;
  ostream *poVar4;
  source_location *in_RCX;
  pair<unsigned_long,_unsigned_long> pVar5;
  _Any_data local_1d0;
  code *local_1c0;
  code *local_1b8;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined **local_30;
  
  pVar5 = Matrix_Dense<double,_0UL,_0UL>::size(matrix_0);
  if ((pVar5.first == 2) && (pVar5.second == 3)) {
    local_1b8 = std::
                _Function_handler<double_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/include/core/matrix_dense.hpp:488:3)>
                ::_M_invoke;
    local_1c0 = std::
                _Function_handler<double_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/include/core/matrix_dense.hpp:488:3)>
                ::_M_manager;
    pVVar1 = (matrix_0->
             super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             ).
             super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pVVar2 = (matrix_0->
             super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             ).
             super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_1d0._M_unused._M_object = matrix_0;
    local_1d0._8_8_ = matrix_1;
    sVar3 = Matrix_Dense<double,_0UL,_0UL>::size_column(matrix_0);
    Matrix_Dense<double,_2UL,_3UL>::Matrix_Dense
              (__return_storage_ptr__,(function<double_(unsigned_long,_unsigned_long)> *)&local_1d0,
               ((long)pVVar1 - (long)pVVar2) / 0x18,sVar3);
    std::_Function_base::~_Function_base((_Function_base *)&local_1d0);
    return __return_storage_ptr__;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"\n");
  local_30 = &PTR_s__workspace_llm4binary_github_lic_001725c8;
  console_format_abi_cxx11_
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0,
             (Disa *)0x0,(Log_Level)&local_30,in_RCX);
  poVar4 = std::operator<<(poVar4,(string *)local_1d0._M_pod_data);
  std::__cxx11::to_string
            (&local_150,
             ((long)(matrix_0->
                    super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                    ).
                    super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(matrix_0->
                   super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                   ).
                   super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  std::operator+(&local_130,"Incompatible matrix dimensions, ",&local_150);
  std::operator+(&local_110,&local_130,",");
  sVar3 = Matrix_Dense<double,_0UL,_0UL>::size_column(matrix_0);
  std::__cxx11::to_string(&local_170,sVar3);
  std::operator+(&local_f0,&local_110,&local_170);
  std::operator+(&local_d0,&local_f0," vs. ");
  std::__cxx11::to_string(&local_190,2);
  std::operator+(&local_b0,&local_d0,&local_190);
  std::operator+(&local_90,&local_b0,",");
  std::__cxx11::to_string(&local_1b0,3);
  std::operator+(&local_70,&local_90,&local_1b0);
  std::operator+(&local_50,&local_70,".");
  poVar4 = std::operator<<(poVar4,(string *)&local_50);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)local_1d0._M_pod_data);
  exit(1);
}

Assistant:

typename Static_Promoter<Matrix_Dense<_type, _row_0, _col_0>, Matrix_Dense<_type, _row_1, _col_1>>::type constexpr
operator+(const Matrix_Dense<_type, _row_0, _col_0>& matrix_0, const Matrix_Dense<_type, _row_1, _col_1>& matrix_1) {
  ASSERT_DEBUG(matrix_0.size() == matrix_1.size(),
               "Incompatible matrix dimensions, " + std::to_string(matrix_0.size_row()) + "," +
               std::to_string(matrix_0.size_column()) + " vs. " + std::to_string(matrix_1.size_row()) + "," +
               std::to_string(matrix_1.size_column()) + ".");
  typedef typename Static_Promoter<Matrix_Dense<_type, _row_0, _col_0>, Matrix_Dense<_type, _row_1, _col_1>>::type
  _return_matrix;
  return _return_matrix(
  [&](std::size_t i_row, std::size_t i_column) { return matrix_0[i_row][i_column] + matrix_1[i_row][i_column]; },
  matrix_0.size_row(), matrix_0.size_column());
}